

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_InvalidCallArg_Test::TestBody(ExprTest_InvalidCallArg_Test *this)

{
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other;
  Arg arg;
  StringRef name;
  bool bVar1;
  char *__s;
  long in_RDI;
  CallExprBuilder CVar2;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  CallExprBuilder builder;
  Function f;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  type_conflict in_stack_fffffffffffffee4;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_fffffffffffffee8;
  Type in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  Type in_stack_ffffffffffffff0c;
  Function in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  undefined1 local_89 [49];
  AssertionResult local_58;
  Impl *local_48;
  int local_40;
  Impl *local_38;
  Impl *local_30;
  int local_28;
  Impl *local_10;
  
  __s = (char *)(in_RDI + 0x10);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  uVar3 = 1;
  name.data_._4_4_ = in_stack_ffffffffffffff04;
  name.data_._0_4_ = in_stack_ffffffffffffff00;
  name.size_._0_4_ = in_stack_ffffffffffffff08;
  name.size_._4_4_ = in_stack_ffffffffffffff0c;
  local_38 = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::AddFunction
                               ((BasicExprFactory<std::allocator<char>_> *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),name,
                                in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
  local_10 = local_38;
  CVar2 = mp::BasicExprFactory<std::allocator<char>_>::BeginCall
                    ((BasicExprFactory<std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff04);
  local_48 = CVar2.impl_;
  local_40 = CVar2.arg_index_;
  local_30 = local_48;
  local_28 = local_40;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (bVar1) {
    in_stack_ffffffffffffff10.impl_ = (Impl *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar3,in_stack_ffffffffffffff20),__s,
               (allocator<char> *)in_stack_ffffffffffffff10.impl_);
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_ffffffffffffff0c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff0c);
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x1252db);
      other.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffef4;
      other.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef0;
      mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                (in_stack_fffffffffffffee8,other,in_stack_fffffffffffffee4);
      arg.super_ExprBase.impl_._4_4_ = in_stack_ffffffffffffff04;
      arg.super_ExprBase.impl_._0_4_ = in_stack_ffffffffffffff00;
      mp::BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
                ((BasicIteratedExprBuilder<mp::CallExpr> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),arg);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)in_stack_ffffffffffffff10.impl_,
               (char (*) [115])CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffff5c = 2;
    std::__cxx11::string::~string((string *)(local_89 + 1));
    if (in_stack_ffffffffffffff5c == 0) goto LAB_0012563e;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff10.impl_);
  testing::AssertionResult::failure_message((AssertionResult *)0x1255b0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff10.impl_,in_stack_ffffffffffffff0c,
             (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc,
             (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  testing::internal::AssertHelper::operator=
            (in_stack_ffffffffffffff60,
             (Message *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  testing::Message::~Message((Message *)0x1255fc);
LAB_0012563e:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12564b);
  return;
}

Assistant:

TEST_F(ExprTest, InvalidCallArg) {
  mp::Function f = factory_.AddFunction("foo", 1);
  auto builder = factory_.BeginCall(f, 1);
  EXPECT_ASSERT(builder.AddArg(NumericExpr()), "invalid argument");
}